

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

KDataStream * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::Encode(KDataStream *__return_storage_ptr__,LE_EulerAngles *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  (*(this->m_Psi).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Psi,__return_storage_ptr__);
  (*(this->m_Theta).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Theta,__return_storage_ptr__)
  ;
  (*(this->m_Phi).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Phi,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LE_EulerAngles::Encode() const
{
    KDataStream stream;

    LE_EulerAngles::Encode( stream );

    return stream;
}